

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

Symbol * findlocsymbol(GlobalVars *gv,ObjectUnit *ou,char *name)

{
  Symbol **ppSVar1;
  int iVar2;
  unsigned_long uVar3;
  Symbol *pSVar4;
  
  ppSVar1 = ou->objsyms;
  uVar3 = elf_hash(name);
  pSVar4 = ppSVar1[(uint)uVar3 & 0x1f];
  while( true ) {
    if (pSVar4 == (Symbol *)0x0) {
      return (Symbol *)0x0;
    }
    iVar2 = strcmp(pSVar4->name,name);
    if (iVar2 == 0) break;
    pSVar4 = pSVar4->obj_chain;
  }
  return pSVar4;
}

Assistant:

struct Symbol *findlocsymbol(struct GlobalVars *gv,struct ObjectUnit *ou,
                             const char *name)
/* find a symbol which is local to the provided ObjectUnit */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(sym->name,name))
      return sym;
    chain = &sym->obj_chain;
  }
  return NULL;
}